

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

void __thiscall
curlpp::FormParts::Content::add(Content *this,curl_httppost **first,curl_httppost **last)

{
  if ((this->mContentType)._M_string_length != 0) {
    curl_formadd(first,last,2,(this->super_FormPart).mName._M_dataplus._M_p,5,
                 (this->mContent)._M_dataplus._M_p,0xe,(this->mContentType)._M_dataplus._M_p,0x11);
    return;
  }
  curl_formadd(first,last,2,(this->super_FormPart).mName._M_dataplus._M_p,5,
               (this->mContent)._M_dataplus._M_p,0x11);
  return;
}

Assistant:

void
curlpp::FormParts::Content::add(::curl_httppost ** first, 
				::curl_httppost ** last)
{
  // We uses options that will copy internally the string (c_str),
  // so we don't need to worry about the memory.
  if(mContentType.empty()) {
    curl_formadd(first, 
		 last, 
		 CURLFORM_PTRNAME, 
		 mName.c_str(), 
		 CURLFORM_PTRCONTENTS,
		 mContent.c_str(),
		 CURLFORM_END);
  }
  else {
    curl_formadd(first, 
		 last, 
		 CURLFORM_PTRNAME, 
		 mName.c_str(), 
		 CURLFORM_PTRCONTENTS,
		 mContent.c_str(),
		 CURLFORM_CONTENTTYPE,
		 mContentType.c_str(),
		 CURLFORM_END );
  }
}